

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O2

string * __thiscall
clask::request::cookie_value(string *__return_storage_ptr__,request *this,string *name)

{
  pointer ppVar1;
  pointer pbVar2;
  bool bVar3;
  __type_conflict _Var4;
  undefined8 uVar5;
  pointer __lhs;
  pointer pbVar6;
  allocator<char> local_f5;
  uint local_f4;
  string *local_f0;
  string value;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  toks;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  elems;
  string path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> v;
  
  value._M_dataplus._M_p = (pointer)&value.field_2;
  value._M_string_length = 0;
  value.field_2._M_local_buf[0] = '\0';
  path._M_dataplus._M_p = (pointer)&path.field_2;
  path._M_string_length = 0;
  path.field_2._M_local_buf[0] = '\0';
  __lhs = (this->headers).
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (this->headers).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_f0 = __return_storage_ptr__;
  do {
    if (__lhs == ppVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_f0,"",(allocator<char> *)&v);
LAB_0011cda9:
      std::__cxx11::string::~string((string *)&path);
      std::__cxx11::string::~string((string *)&value);
      return local_f0;
    }
    bVar3 = std::operator==(&__lhs->first,"Cookie");
    if (bVar3) {
      split_string(&elems,&__lhs->second,';',0xffffffffffffffff);
      pbVar2 = elems.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_f4 = 0;
      for (pbVar6 = elems.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pbVar6 != pbVar2; pbVar6 = pbVar6 + 1
          ) {
        std::__cxx11::string::string((string *)&v,(string *)pbVar6);
        std::__cxx11::string::string<std::allocator<char>>((string *)&toks," \t\v\r\n",&local_f5);
        trim_string(&v,(string *)&toks);
        std::__cxx11::string::~string((string *)&toks);
        split_string(&toks,&v,'=',0xffffffffffffffff);
        if ((long)toks.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)toks.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start == 0x40) {
          _Var4 = std::operator==(toks.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start,name);
          if (_Var4) {
            uVar5 = std::__cxx11::string::_M_assign((string *)&value);
            local_f4 = (uint)CONCAT71((int7)((ulong)uVar5 >> 8),1);
          }
        }
        if ((long)toks.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)toks.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start == 0x40) {
          bVar3 = std::operator==(toks.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start,"path");
          if (bVar3) {
            std::__cxx11::string::_M_assign((string *)&path);
          }
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&toks);
        std::__cxx11::string::~string((string *)&v);
      }
      if ((local_f4 & 1) != 0) {
        if (path._M_string_length != 0) {
          std::__cxx11::string::substr((ulong)&v,(ulong)&this->uri);
          _Var4 = std::operator==(&v,&path);
          std::__cxx11::string::~string((string *)&v);
          if (!_Var4) goto LAB_0011cd24;
        }
        (local_f0->_M_dataplus)._M_p = (pointer)&local_f0->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)value._M_dataplus._M_p == &value.field_2) {
          (local_f0->field_2)._M_allocated_capacity =
               CONCAT71(value.field_2._M_allocated_capacity._1_7_,value.field_2._M_local_buf[0]);
          *(undefined8 *)((long)&local_f0->field_2 + 8) = value.field_2._8_8_;
        }
        else {
          (local_f0->_M_dataplus)._M_p = value._M_dataplus._M_p;
          (local_f0->field_2)._M_allocated_capacity =
               CONCAT71(value.field_2._M_allocated_capacity._1_7_,value.field_2._M_local_buf[0]);
        }
        local_f0->_M_string_length = value._M_string_length;
        value._M_string_length = 0;
        value.field_2._M_local_buf[0] = '\0';
        value._M_dataplus._M_p = (pointer)&value.field_2;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&elems);
        goto LAB_0011cda9;
      }
LAB_0011cd24:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&elems);
    }
    __lhs = __lhs + 1;
  } while( true );
}

Assistant:

inline std::string request::cookie_value(const std::string& name) {
  std::string value, path;
  for (auto&& header : headers) {
    if (header.first == "Cookie") {
      auto elems = split_string(header.second, ';');
      auto found = false;
      for (auto&& elem : elems) {
        auto v = elem;
        trim_string(v);
        auto toks = split_string(v, '=');
        if (toks.size() == 2 && toks[0] == name) {
          value = toks[1];
          found = true;
        }
        if (toks.size() == 2 && toks[0] == "path") {
          path = toks[1];
        }
      }
      if (found) {
        if (path.empty() || uri.substr(path.size()) == path) {
          return value;
        }
      }
    }
  }
  return "";
}